

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_visualization.cpp
# Opt level: O2

void __thiscall lumeview::PlainVisualization::refresh(PlainVisualization *this)

{
  Renderer *this_00;
  Mesh *pMVar1;
  element_type *mesh;
  bool bVar2;
  SPMesh *pSVar3;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  SPMesh bndMesh;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_198;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_188;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_158;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_148;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2> local_108;
  anon_union_16_4_ea85571f_for_tvec4<float,_(glm::precision)0>_2 local_f8;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this_00 = &this->m_renderer;
  Renderer::clear(this_00);
  local_188._0_8_ = 0x3f57ced93f800000;
  local_188._8_8_ = 0x3f80000000000000;
  local_198._0_8_ = 0x3e4ccccd3e4ccccd;
  local_198._8_8_ = 0x3f8000003e4ccccd;
  local_f8._0_8_ = 0x3e4ccccd3f800000;
  local_f8._8_8_ = 0x3f8000003e4ccccd;
  pSVar3 = &this->m_mesh;
  bVar2 = lume::Mesh::has((this->m_mesh).super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,(GrobSet)0x3b);
  if (bVar2) {
    std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_108,&pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
    local_1e8._M_unused._M_object = (void *)0x0;
    local_1e8._8_8_ = 0;
    local_1d0 = std::
                _Function_handler<bool_(const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:56:36)>
                ::_M_invoke;
    local_1d8 = std::
                _Function_handler<bool_(const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:56:36)>
                ::_M_manager;
    local_1b8._M_unused._M_object = (void *)0x0;
    local_1b8._8_8_ = 0;
    local_1a0 = std::
                _Function_handler<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:58:44)>
                ::_M_invoke;
    local_1a8 = std::
                _Function_handler<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:58:44)>
                ::_M_manager;
    lume::CreateRimMesh((lume *)&bndMesh,(SPMesh *)&local_108,(GrobSet)0x3b,
                        (function<bool_(const_lume::GrobIndex_&)> *)&local_1e8,
                        (function<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&)> *)
                        &local_1b8,(Neighborhoods *)0x0);
    std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
    mesh = bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string
              ((string *)local_1e8._M_pod_data,"normals",(allocator *)local_1b8._M_pod_data);
    lume::ComputeFaceVertexNormals3(mesh,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)local_1e8._M_pod_data);
    lume::CreateSideGrobs
              (bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,1);
    std::__cxx11::string::string((string *)&local_48,"solid",(allocator *)local_1e8._M_pod_data);
    std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_118,&bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
    Renderer::add_stage(this_00,&local_48,(SPMesh *)&local_118,(GrobSet)0x34,FLAT);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
    std::__cxx11::string::~string((string *)&local_48);
    Renderer::stage_set_color(this_00,(vec4 *)&local_188.field_0,-1);
    std::__cxx11::string::string((string *)&local_68,"wire",(allocator *)local_1e8._M_pod_data);
    std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_128,&bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
    Renderer::add_stage(this_00,&local_68,(SPMesh *)&local_128,(GrobSet)0x4,FLAT);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
    std::__cxx11::string::~string((string *)&local_68);
    Renderer::stage_set_color(this_00,(vec4 *)&local_198.field_0,-1);
  }
  else {
    bVar2 = lume::Mesh::has((pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr,(GrobSet)0x34);
    pMVar1 = (pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (!bVar2) {
      bVar2 = lume::Mesh::has(pMVar1,(GrobSet)0x4);
      if (!bVar2) {
        return;
      }
      pMVar1 = (pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::string
                ((string *)local_1e8._M_pod_data,"normals",(allocator *)local_1b8._M_pod_data);
      lume::ComputeFaceVertexNormals3(pMVar1,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)local_1e8._M_pod_data);
      std::__cxx11::string::string((string *)&local_e8,"wire",(allocator *)local_1e8._M_pod_data);
      std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_178,&pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
      Renderer::add_stage(this_00,&local_e8,(SPMesh *)&local_178,(GrobSet)0x4,NONE);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
      std::__cxx11::string::~string((string *)&local_e8);
      Renderer::stage_set_color(this_00,(vec4 *)&local_198.field_0,-1);
      return;
    }
    std::__cxx11::string::string
              ((string *)local_1e8._M_pod_data,"normals",(allocator *)local_1b8._M_pod_data);
    lume::ComputeFaceVertexNormals3(pMVar1,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)local_1e8._M_pod_data);
    lume::CreateSideGrobs
              ((pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,1);
    std::__cxx11::string::string((string *)&local_88,"solid",(allocator *)local_1e8._M_pod_data);
    std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_138,&pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
    Renderer::add_stage(this_00,&local_88,(SPMesh *)&local_138,(GrobSet)0x34,FLAT);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
    std::__cxx11::string::~string((string *)&local_88);
    Renderer::stage_set_color(this_00,(vec4 *)&local_188.field_0,-1);
    std::__cxx11::string::string((string *)&local_a8,"wire",(allocator *)local_1e8._M_pod_data);
    std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_148,&pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
    Renderer::add_stage(this_00,&local_a8,(SPMesh *)&local_148,(GrobSet)0x4,FLAT);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_148._M_refcount);
    std::__cxx11::string::~string((string *)&local_a8);
    Renderer::stage_set_color(this_00,(vec4 *)&local_198.field_0,-1);
    std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_158,&pSVar3->super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
    local_1e8._M_unused._M_object = (void *)0x0;
    local_1e8._8_8_ = 0;
    local_1d0 = std::
                _Function_handler<bool_(const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:56:36)>
                ::_M_invoke;
    local_1d8 = std::
                _Function_handler<bool_(const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:56:36)>
                ::_M_manager;
    local_1b8._M_unused._M_object = (void *)0x0;
    local_1b8._8_8_ = 0;
    local_1a0 = std::
                _Function_handler<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:58:44)>
                ::_M_invoke;
    local_1a8 = std::
                _Function_handler<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&),_lume::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/include/lume/rim_mesh.h:58:44)>
                ::_M_manager;
    lume::CreateRimMesh((lume *)&bndMesh,(SPMesh *)&local_158,(GrobSet)0x34,
                        (function<bool_(const_lume::GrobIndex_&)> *)&local_1e8,
                        (function<void_(const_lume::GrobIndex_&,_const_lume::GrobIndex_&)> *)
                        &local_1b8,(Neighborhoods *)0x0);
    std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
    std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
    bVar2 = lume::Mesh::has(bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr,(GrobSet)0x4);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_c8,"bnd",(allocator *)local_1e8._M_pod_data);
      std::__shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_168,&bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>);
      Renderer::add_stage(this_00,&local_c8,(SPMesh *)&local_168,(GrobSet)0x4,NONE);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
      std::__cxx11::string::~string((string *)&local_c8);
      Renderer::stage_set_color(this_00,(vec4 *)&local_f8.field_0,-1);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bndMesh.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void PlainVisualization::
refresh ()
{
	m_renderer.clear();

	const glm::vec4 solidColor (1.0f, 0.843f, 0.f, 1.0f);
	const glm::vec4 wireColor (0.2f, 0.2f, 0.2f, 1.0f);
	const glm::vec4 bndColor (1.0f, 0.2f, 0.2f, 1.0f);

	if (m_mesh->has (CELLS)) {
		auto bndMesh = CreateRimMesh (m_mesh, CELLS);
		ComputeFaceVertexNormals3 (*bndMesh, "normals");
		CreateSideGrobs (*bndMesh, 1);
		m_renderer.add_stage ("solid", bndMesh, FACES, FLAT);
		m_renderer.stage_set_color (solidColor);
		m_renderer.add_stage ("wire", bndMesh, EDGES, FLAT);
		m_renderer.stage_set_color (wireColor);
	}
	else if (m_mesh->has (FACES)) {
		ComputeFaceVertexNormals3 (*m_mesh, "normals");
		CreateSideGrobs (*m_mesh, 1);
		m_renderer.add_stage ("solid", m_mesh, FACES, FLAT);
		m_renderer.stage_set_color (solidColor);
		m_renderer.add_stage ("wire", m_mesh, EDGES, FLAT);
		m_renderer.stage_set_color (wireColor);
		auto bndMesh = CreateRimMesh (m_mesh, FACES);
		if (bndMesh->has (EDGES)) {
			m_renderer.add_stage ("bnd", bndMesh, EDGES, NONE);
			m_renderer.stage_set_color (bndColor);
		}
	}
	else if (m_mesh->has (EDGES)) {
		ComputeFaceVertexNormals3 (*m_mesh, "normals");
		m_renderer.add_stage ("wire", m_mesh, EDGES, NONE);
		m_renderer.stage_set_color (wireColor);
	}
}